

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_matrix.c
# Opt level: O0

SUNErrCode SUNMatCopyOps(SUNMatrix A,SUNMatrix B)

{
  SUNContext sunctx_local_scope_;
  SUNMatrix B_local;
  SUNMatrix A_local;
  
  B->ops->getid = A->ops->getid;
  B->ops->clone = A->ops->clone;
  B->ops->destroy = A->ops->destroy;
  B->ops->zero = A->ops->zero;
  B->ops->copy = A->ops->copy;
  B->ops->scaleadd = A->ops->scaleadd;
  B->ops->scaleaddi = A->ops->scaleaddi;
  B->ops->matvecsetup = A->ops->matvecsetup;
  B->ops->matvec = A->ops->matvec;
  B->ops->space = A->ops->space;
  return 0;
}

Assistant:

SUNErrCode SUNMatCopyOps(SUNMatrix A, SUNMatrix B)
{
  SUNFunctionBegin(A->sunctx);
  /* Check that ops structures exist */
  SUNAssert(A && A->ops, SUN_ERR_ARG_CORRUPT);
  SUNAssert(B && B->ops, SUN_ERR_ARG_CORRUPT);

  /* Copy ops from A to B */
  B->ops->getid       = A->ops->getid;
  B->ops->clone       = A->ops->clone;
  B->ops->destroy     = A->ops->destroy;
  B->ops->zero        = A->ops->zero;
  B->ops->copy        = A->ops->copy;
  B->ops->scaleadd    = A->ops->scaleadd;
  B->ops->scaleaddi   = A->ops->scaleaddi;
  B->ops->matvecsetup = A->ops->matvecsetup;
  B->ops->matvec      = A->ops->matvec;
  B->ops->space       = A->ops->space;

  return (0);
}